

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

Variant * __thiscall
Jinx::Impl::Script::CallNativeFunction
          (Variant *__return_storage_ptr__,Script *this,FunctionDefinitionPtr *fnDef)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  Parameters params;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_98;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<Jinx::IScript> local_68;
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  local_50;
  
  local_98.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = ((fnDef->super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr)->m_parameterCount;
  lVar2 = sVar1 * -0x28;
  sVar3 = sVar1;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
              (&local_98,
               (value_type *)
               ((long)&((this->m_stack).
                        super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->m_type + lVar2));
    lVar2 = lVar2 + 0x28;
  }
  while (bVar4 = sVar1 != 0, sVar1 = sVar1 - 1, bVar4) {
    std::vector<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>::pop_back
              (&this->m_stack);
  }
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::function(&local_50,
             &((fnDef->
               super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->m_callback);
  std::__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Impl::Script,void>
            ((__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (__weak_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<Jinx::Impl::Script>);
  local_68.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_68.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  ::operator()(__return_storage_ptr__,&local_50,&local_68,&local_98);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_98);
  return __return_storage_ptr__;
}

Assistant:

inline Variant Script::CallNativeFunction(const FunctionDefinitionPtr & fnDef)
	{
		Parameters params;
		size_t numParams = fnDef->GetParameterCount();
		for (size_t i = 0; i < numParams; ++i)
		{
			size_t index = m_stack.size() - (numParams - i);
			const auto & param = m_stack[index];
			params.push_back(param);
		}
		for (size_t i = 0; i < numParams; ++i)
			m_stack.pop_back();
		return fnDef->GetCallback()(shared_from_this(), params);
	}